

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.cpp
# Opt level: O2

int __thiscall arbiter::drivers::Fs::copy(Fs *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  int iVar1;
  ArbiterError *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  string local_468;
  string local_448;
  ifstream instream;
  streambuf local_418 [9];
  byte abStack_40f [7];
  int aiStack_408 [122];
  ofstream outstream;
  int aiStack_200 [120];
  
  ::std::__cxx11::string::string((string *)&local_448,(string *)dst);
  expandTilde((string *)&instream,&local_448);
  ::std::__cxx11::string::operator=((string *)dst,(string *)&instream);
  ::std::__cxx11::string::~string((string *)&instream);
  ::std::__cxx11::string::~string((string *)&local_448);
  ::std::__cxx11::string::string((string *)&local_468,(string *)src);
  expandTilde((string *)&instream,&local_468);
  ::std::__cxx11::string::operator=((string *)src,(string *)&instream);
  ::std::__cxx11::string::~string((string *)&instream);
  ::std::__cxx11::string::~string((string *)&local_468);
  ::std::ifstream::ifstream(&instream,(string *)dst,_S_in|_S_bin);
  if (*(int *)((long)aiStack_408 + *(long *)(_instream + -0x18)) != 0) {
    pAVar2 = (ArbiterError *)__cxa_allocate_exception(0x10);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outstream
                     ,"Could not open ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dst);
    ::std::operator+(&local_488,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&outstream
                     ," for reading");
    ArbiterError::ArbiterError(pAVar2,&local_488);
    __cxa_throw(pAVar2,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
  }
  abStack_40f[*(long *)(_instream + -0x18)] = abStack_40f[*(long *)(_instream + -0x18)] & 0xef;
  ::std::ofstream::ofstream(&outstream,(string *)src,_S_trunc|_S_out|_S_bin);
  if (*(int *)((long)aiStack_200 + *(long *)(_outstream + -0x18)) == 0) {
    ::std::ostream::operator<<((ostream *)&outstream,local_418);
    ::std::ofstream::~ofstream(&outstream);
    iVar1 = ::std::ifstream::~ifstream(&instream);
    return iVar1;
  }
  pAVar2 = (ArbiterError *)__cxa_allocate_exception(0x10);
  ::std::operator+(&bStack_4c8,"Could not open ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)src);
  ::std::operator+(&local_4a8,&bStack_4c8," for writing");
  ArbiterError::ArbiterError(pAVar2,&local_4a8);
  __cxa_throw(pAVar2,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Fs::copy(std::string src, std::string dst) const
{
    src = expandTilde(src);
    dst = expandTilde(dst);

    std::ifstream instream(src, std::ifstream::in | std::ifstream::binary);
    if (!instream.good())
    {
        throw ArbiterError("Could not open " + src + " for reading");
    }
    instream >> std::noskipws;

    std::ofstream outstream(dst, binaryTruncMode);
    if (!outstream.good())
    {
        throw ArbiterError("Could not open " + dst + " for writing");
    }

    outstream << instream.rdbuf();
}